

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void QAnimationTimer::ensureTimerUpdate(void)

{
  long lVar1;
  long lVar2;
  
  lVar2 = __tls_get_addr(&PTR_006a9338);
  if (*(char *)(lVar2 + 0x80) == '\0') {
    ensureTimerUpdate();
  }
  lVar1 = *(long *)(lVar2 + 0x78);
  if (*(char *)(lVar2 + 0x70) == '\0') {
    ensureTimerUpdate();
  }
  if ((lVar1 != 0 && *(QUnifiedTimer **)(lVar2 + 0x68) != (QUnifiedTimer *)0x0) &&
     (*(char *)(lVar1 + 0x11) == '\x01')) {
    QUnifiedTimer::updateAnimationTimers(*(QUnifiedTimer **)(lVar2 + 0x68));
    return;
  }
  return;
}

Assistant:

QAnimationTimer *QAnimationTimer::instance(bool create)
{
    QAnimationTimer *inst;
#if QT_CONFIG(thread)
    static thread_local std::unique_ptr<QAnimationTimer> animationTimer;
    if (create && !animationTimer) {
        inst = new QAnimationTimer;
        animationTimer.reset(inst);
    } else {
        inst = animationTimer.get();
    }
#else
    Q_UNUSED(create);
    static QAnimationTimer animationTimer;
    inst = &animationTimer;
#endif
    return inst;
}